

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

QRect __thiscall QAccessibleLineEdit::characterRect(QAccessibleLineEdit *this,int offset)

{
  QRect QVar1;
  bool bVar2;
  QWidget *this_00;
  QFont *pQVar3;
  QPoint *pos;
  int in_ESI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  int h;
  int w;
  int y;
  int x;
  QString ch;
  QFontMetrics fm;
  QRect r;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  QWidgetLineControl *in_stack_ffffffffffffff78;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QMargins local_28;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lineEdit((QAccessibleLineEdit *)0x7f07c4);
  QLineEdit::d_func((QLineEdit *)0x7f07cc);
  QWidgetLineControl::cursorToX(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  lineEdit((QAccessibleLineEdit *)0x7f07ee);
  local_28 = QLineEdit::textMargins((QLineEdit *)in_stack_ffffffffffffff78);
  QMargins::top((QMargins *)0x7f080a);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = &lineEdit((QAccessibleLineEdit *)0x7f0824)->super_QWidget;
  pQVar3 = QWidget::font(this_00);
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_30,pQVar3);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)in_RDI + 0xf8))(&local_48,in_RDI,in_ESI,in_ESI + 1);
  bVar2 = QString::isEmpty((QString *)0x7f0885);
  if (bVar2) {
    QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
  else {
    QFontMetrics::horizontalAdvance((QString *)&local_30,(int)&local_48);
    QFontMetrics::height();
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QRect::QRect((QRect *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                 in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    pos = (QPoint *)lineEdit((QAccessibleLineEdit *)0x7f0911);
    QRect::topLeft((QRect *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QWidget::mapToGlobal(in_RDI,pos);
    QRect::moveTo((QRect *)in_RDI,pos);
  }
  QString::~QString((QString *)0x7f0960);
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar1.x2.m_i = (int)local_10;
    QVar1._0_8_ = local_18;
    QVar1.y2.m_i = (int)((ulong)local_10 >> 0x20);
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QRect QAccessibleLineEdit::characterRect(int offset) const
{
    int x = lineEdit()->d_func()->control->cursorToX(offset);
    int y = lineEdit()->textMargins().top();
    QFontMetrics fm(lineEdit()->font());
    const QString ch = text(offset, offset + 1);
    if (ch.isEmpty())
        return QRect();
    int w = fm.horizontalAdvance(ch);
    int h = fm.height();
    QRect r(x, y, w, h);
    r.moveTo(lineEdit()->mapToGlobal(r.topLeft()));
    return r;
}